

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int key_schedule_extract(st_ptls_key_schedule_t *sched,ptls_iovec_t ikm)

{
  ptls_hash_algorithm_t *algo;
  int iVar1;
  ptls_iovec_t pVar2;
  ptls_iovec_t salt;
  st_ptls_key_schedule_t *psStack_30;
  int ret;
  uint8_t *local_28;
  st_ptls_key_schedule_t *sched_local;
  ptls_iovec_t ikm_local;
  
  ikm_local.base = (uint8_t *)ikm.len;
  sched_local = (st_ptls_key_schedule_t *)ikm.base;
  if (sched_local == (st_ptls_key_schedule_t *)0x0) {
    pVar2 = ptls_iovec_init(zeroes_of_max_digest_size,sched->algo->digest_size);
    psStack_30 = (st_ptls_key_schedule_t *)pVar2.base;
    sched_local = psStack_30;
    local_28 = (uint8_t *)pVar2.len;
    ikm_local.base = local_28;
  }
  sched->generation = sched->generation + 1;
  algo = sched->algo;
  salt = ptls_iovec_init(sched->secret,sched->algo->digest_size);
  pVar2.len = (size_t)ikm_local.base;
  pVar2.base = (uint8_t *)sched_local;
  iVar1 = ptls_hkdf_extract(algo,sched->secret,salt,pVar2);
  return iVar1;
}

Assistant:

static int key_schedule_extract(struct st_ptls_key_schedule_t *sched, ptls_iovec_t ikm)
{
    if (ikm.base == NULL)
        ikm = ptls_iovec_init(zeroes_of_max_digest_size, sched->algo->digest_size);

    ++sched->generation;
    int ret = ptls_hkdf_extract(sched->algo, sched->secret, ptls_iovec_init(sched->secret, sched->algo->digest_size), ikm);
    PTLS_DEBUGF("%s: %u, %02x%02x\n", __FUNCTION__, sched->generation, (int)sched->secret[0], (int)sched->secret[1]);
    return ret;
}